

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInputPart.cpp
# Opt level: O0

void testInputPart(string *tempDir)

{
  int iVar1;
  ostream *poVar2;
  string *tempDir_00;
  exception *e;
  int numThreads;
  int randomReadCount;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Testing reading multipart tiles and scanlines with InputPart");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  randomReadCount = (int)((ulong)poVar2 >> 0x20);
  random_reseed(0);
  tempDir_00 = (string *)IlmThread_3_4::ThreadPool::globalThreadPool();
  IlmThread_3_4::ThreadPool::numThreads();
  iVar1 = IlmThread_3_4::ThreadPool::globalThreadPool();
  IlmThread_3_4::ThreadPool::setNumThreads(iVar1);
  anon_unknown.dwarf_130cbb::testWriteRead
            (in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,randomReadCount,tempDir_00);
  anon_unknown.dwarf_130cbb::testWriteRead
            (in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,randomReadCount,tempDir_00);
  anon_unknown.dwarf_130cbb::testWriteRead
            (in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,randomReadCount,tempDir_00);
  anon_unknown.dwarf_130cbb::testWriteRead
            (in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,randomReadCount,tempDir_00);
  iVar1 = IlmThread_3_4::ThreadPool::globalThreadPool();
  IlmThread_3_4::ThreadPool::setNumThreads(iVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testInputPart (const std::string& tempDir)
{
    try
    {
        cout << "Testing reading multipart tiles and scanlines with InputPart"
             << endl;

        random_reseed (1);

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (4);

        testWriteRead (1, 1, 5, tempDir);
        testWriteRead (2, 2, 1, tempDir);
        testWriteRead (8, 4, 2, tempDir);
        testWriteRead (50, 3, 11, tempDir);

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}